

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac.c
# Opt level: O2

int tc_hmac_final(uint8_t *tag,uint taglen,TCHmacState_t ctx)

{
  bool bVar1;
  
  bVar1 = (ctx != (TCHmacState_t)0x0 && tag != (uint8_t *)0x0) && taglen == 0x20;
  if (bVar1) {
    tc_sha256_final(tag,&ctx->hash_state);
    tc_sha256_init(&ctx->hash_state);
    tc_sha256_update(&ctx->hash_state,ctx->key + 0x40,0x40);
    tc_sha256_update(&ctx->hash_state,tag,0x20);
    tc_sha256_final(tag,&ctx->hash_state);
    _set(ctx,'\0',0xf0);
  }
  return (uint)bVar1;
}

Assistant:

int tc_hmac_final(uint8_t *tag, unsigned int taglen, TCHmacState_t ctx)
{

	/* input sanity check: */
	if (tag == (uint8_t *) 0 ||
	    taglen != TC_SHA256_DIGEST_SIZE ||
	    ctx == (TCHmacState_t) 0) {
		return TC_CRYPTO_FAIL;
	}

	(void) tc_sha256_final(tag, &ctx->hash_state);

	(void)tc_sha256_init(&ctx->hash_state);
	(void)tc_sha256_update(&ctx->hash_state,
			       &ctx->key[TC_SHA256_BLOCK_SIZE],
				TC_SHA256_BLOCK_SIZE);
	(void)tc_sha256_update(&ctx->hash_state, tag, TC_SHA256_DIGEST_SIZE);
	(void)tc_sha256_final(tag, &ctx->hash_state);

	/* destroy the current state */
	_set(ctx, 0, sizeof(*ctx));

	return TC_CRYPTO_SUCCESS;
}